

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

void __thiscall
slang::SourceManager::addLineDirective
          (SourceManager *this,SourceLocation location,size_t lineNum,string_view name,uint8_t level
          )

{
  SourceLocation this_00;
  FileInfo *this_01;
  ulong uVar1;
  unsigned_long *__args_1;
  string *__args_2;
  undefined8 in_RSI;
  SourceManager *in_RDI;
  size_t sourceLineNum;
  error_code ec;
  path linePath;
  path full;
  FileInfo *info;
  SourceLocation fileLocation;
  unique_lock<std::shared_mutex> lock;
  mutex_type *in_stack_fffffffffffffe38;
  path *in_stack_fffffffffffffe40;
  path *in_stack_fffffffffffffe48;
  SourceManager *in_stack_fffffffffffffe50;
  path *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  SourceLocation location_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  format in_stack_fffffffffffffe97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  SourceManager *in_stack_fffffffffffffea0;
  path local_148;
  error_code local_120 [2];
  path local_f8 [2];
  path local_98;
  undefined4 local_70;
  uint32_t local_6c;
  FileInfo *local_68;
  undefined8 local_50;
  SourceLocation local_48;
  undefined1 local_40 [56];
  undefined8 local_8;
  
  location_00 = (SourceLocation)local_40;
  local_8 = in_RSI;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_50 = local_8;
  this_00 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>
                      (in_RDI,location_00,
                       (unique_lock<std::shared_mutex> *)
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_48 = this_00;
  local_6c = (uint32_t)SourceLocation::buffer((SourceLocation *)in_stack_fffffffffffffe48);
  this_01 = getFileInfo<std::unique_lock<std::shared_mutex>_>
                      (in_stack_fffffffffffffe50,
                       (BufferID)(uint32_t)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                       (unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe48);
  local_68 = this_01;
  if ((this_01 == (FileInfo *)0x0) || (this_01->data == (FileData *)0x0)) {
    local_70 = 1;
  }
  else {
    std::filesystem::__cxx11::path::path(in_stack_fffffffffffffe40);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,this_00._7_1_);
    std::error_code::error_code((error_code *)in_stack_fffffffffffffe40);
    if (((in_RDI->disableProximatePaths & 1U) == 0) &&
       (uVar1 = std::filesystem::__cxx11::path::has_relative_path(), (uVar1 & 1) != 0)) {
      std::filesystem::current_path_abi_cxx11_(local_120);
      std::filesystem::__cxx11::path::lexically_proximate(local_f8);
      std::filesystem::__cxx11::path::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40)
      ;
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe40);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe40);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe97);
      in_stack_fffffffffffffe58 =
           (path *)std::filesystem::__cxx11::path::replace_filename(&local_148);
      std::filesystem::__cxx11::path::operator=(&local_98,in_stack_fffffffffffffe58);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe40);
    }
    __args_1 = (unsigned_long *)
               getRawLineNumber<std::unique_lock<std::shared_mutex>_>
                         (in_stack_fffffffffffffea0,local_48,
                          (unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe40 = (path *)&local_68->lineDirectives;
    __args_2 = getU8Str((path *)0x18abf7);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)location_00);
    std::
    vector<slang::SourceManager::LineDirectiveInfo,std::allocator<slang::SourceManager::LineDirectiveInfo>>
    ::emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,unsigned_char&>
              ((vector<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
                *)this_01,&in_stack_fffffffffffffe58->_M_pathname,__args_1,(unsigned_long *)__args_2
               ,(uchar *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(&in_stack_fffffffffffffe40->_M_pathname);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe40);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe40);
    local_70 = 0;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

void SourceManager::addLineDirective(SourceLocation location, size_t lineNum, std::string_view name,
                                     uint8_t level) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);
    FileInfo* info = getFileInfo(fileLocation.buffer(), lock);
    if (!info || !info->data)
        return;

    fs::path full;
    fs::path linePath = name;
    std::error_code ec;
    if (!disableProximatePaths && linePath.has_relative_path())
        full = linePath.lexically_proximate(fs::current_path(ec));
    else
        full = fs::path(info->data->name).replace_filename(linePath);

    size_t sourceLineNum = getRawLineNumber(fileLocation, lock);
    info->lineDirectives.emplace_back(std::string(getU8Str(full)), sourceLineNum, lineNum, level);
}